

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void std::__insertion_sort<QList<QByteArrayView>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
               (QByteArrayView *__first,QByteArrayView *__last)

{
  qsizetype qVar1;
  storage_type *psVar2;
  storage_type *psVar3;
  QByteArrayView *lhs;
  QByteArrayView *pQVar4;
  strong_ordering sVar5;
  long lVar6;
  QByteArrayView *pQVar7;
  
  if (__first != __last) {
    pQVar4 = __first + 1;
    pQVar7 = __first;
    while (lhs = pQVar4, lhs != __last) {
      sVar5 = compareThreeWay(lhs,__first);
      if (sVar5.m_order < '\0') {
        qVar1 = pQVar7[1].m_size;
        psVar2 = pQVar7[1].m_data;
        lVar6 = (long)lhs - (long)__first >> 4;
        if (0 < lVar6) {
          lVar6 = lVar6 + 1;
          pQVar7 = lhs;
          do {
            psVar3 = pQVar7[-1].m_data;
            pQVar7->m_size = pQVar7[-1].m_size;
            pQVar7->m_data = psVar3;
            pQVar7 = pQVar7 + -1;
            lVar6 = lVar6 + -1;
          } while (1 < lVar6);
        }
        __first->m_size = qVar1;
        __first->m_data = psVar2;
      }
      else {
        __unguarded_linear_insert<QList<QByteArrayView>::iterator,__gnu_cxx::__ops::_Val_less_iter>
                  (lhs);
      }
      pQVar7 = lhs;
      pQVar4 = lhs + 1;
    }
  }
  return;
}

Assistant:

inline constexpr bool operator!=(iterator o) const { return i != o.i; }